

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteBase64(xmlTextWriterPtr writer,char *data,int start,int len)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk;
  xmlTextWriterStackEntry *p;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uchar igroup [3];
  char local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  int local_3c;
  xmlOutputBufferPtr local_38;
  
  iVar1 = -1;
  if (-1 < (len | start) && (data != (char *)0x0 && writer != (xmlTextWriterPtr)0x0)) {
    lk = xmlListFront(writer->nodes);
    local_3c = 0;
    if (((lk != (xmlLinkPtr)0x0) &&
        (p = (xmlTextWriterStackEntry *)xmlLinkGetData(lk), local_3c = 0,
        p != (xmlTextWriterStackEntry *)0x0)) &&
       (local_3c = xmlTextWriterHandleStateDependencies(writer,p), local_3c < 0)) {
      return -1;
    }
    if (writer->indent != 0) {
      writer->doindent = 0;
    }
    local_38 = writer->out;
    if (local_38 != (xmlOutputBufferPtr)0x0) {
      lVar5 = 0;
      iVar1 = 0;
      iVar4 = 0;
      do {
        igroup[2] = '\0';
        igroup[0] = '\0';
        igroup[1] = '\0';
        iVar2 = (int)lVar5;
        for (uVar3 = 0; (lVar5 = (long)iVar2 + uVar3, uVar3 < 3 && (lVar5 < len)); uVar3 = uVar3 + 1
            ) {
          igroup[uVar3] = data[uVar3 + (long)iVar2 + (ulong)(uint)start];
        }
        if (uVar3 != 0) {
          local_40 = xmlOutputBufferWriteBase64_dtable[igroup[0] >> 2];
          local_3f = xmlOutputBufferWriteBase64_dtable
                     [(uint)(igroup[1] >> 4) | (igroup[0] & 3) << 4];
          local_3e = xmlOutputBufferWriteBase64_dtable
                     [(uint)(igroup[2] >> 6) + (igroup[1] & 0xf) * 4];
          local_3d = xmlOutputBufferWriteBase64_dtable[igroup[2] & 0x3f];
          if ((uVar3 < 3) && (local_3d = 0x3d, uVar3 != 2)) {
            local_3e = 0x3d;
          }
          if (0x47 < iVar1) {
            iVar1 = xmlOutputBufferWrite(local_38,2,"\r\n");
            if (iVar1 == -1) {
              return -1;
            }
            iVar4 = iVar4 + iVar1;
            iVar1 = 0;
          }
          iVar2 = xmlOutputBufferWrite(local_38,4,&local_40);
          if (iVar2 == -1) {
            return -1;
          }
          iVar4 = iVar4 + iVar2;
          iVar1 = iVar1 + 4;
        }
      } while (lVar5 < len);
      iVar1 = -1;
      if (-1 < iVar4) {
        iVar1 = iVar4 + local_3c;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextWriterWriteBase64(xmlTextWriterPtr writer, const char *data,
                         int start, int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (data == NULL) || (start < 0) || (len < 0))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            count = xmlTextWriterHandleStateDependencies(writer, p);
            if (count < 0)
                return -1;
            sum += count;
        }
    }

    if (writer->indent)
        writer->doindent = 0;

    count =
        xmlOutputBufferWriteBase64(writer->out, len,
                                   (unsigned char *) data + start);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}